

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateHashCodeCode
          (EnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,"result = 31 * result + ");
  bVar1 = Params::use_reference_types_for_primitives((this->super_FieldGenerator).params_);
  if ((!bVar1) ||
     (bVar1 = Params::reftypes_primitive_enums((this->super_FieldGenerator).params_), bVar1)) {
    io::Printer::Print(printer,&this->variables_,"this.$name$");
  }
  else {
    io::Printer::Print(printer,&this->variables_,"(this.$name$ == null ? 0 : this.$name$)");
  }
  io::Printer::Print(printer,";\n");
  return;
}

Assistant:

void EnumFieldGenerator::GenerateHashCodeCode(io::Printer* printer) const {
  printer->Print(
    "result = 31 * result + ");
  if (params_.use_reference_types_for_primitives()
        && !params_.reftypes_primitive_enums()) {
    printer->Print(variables_,
      "(this.$name$ == null ? 0 : this.$name$)");
  } else {
    printer->Print(variables_,
      "this.$name$");
  }
  printer->Print(";\n");
}